

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

Ref<embree::Image> embree::loadImage(FileName *fileName,bool cache)

{
  byte bVar1;
  mapped_type *pmVar2;
  byte in_DL;
  Image *in_RDI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::Image>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::Image>_>_>_>
  *in_stack_fffffffffffffec8;
  undefined7 in_stack_ffffffffffffff08;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::Image>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::Image>_>_>_>
  *this;
  string local_d0 [32];
  string local_b0 [32];
  long *local_90;
  _Self local_88 [2];
  FileName *in_stack_ffffffffffffff88;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::Image>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::Image>_>_>_>
  local_70;
  long **local_30;
  mapped_type *local_28;
  long **local_20;
  mapped_type *local_10;
  
  local_70._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = in_DL & 1;
  if (local_70._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ == 0) {
    loadImageFromDisk(in_stack_ffffffffffffff88);
  }
  else {
    this = &local_70;
    FileName::operator_cast_to_string((FileName *)in_stack_fffffffffffffec8);
    local_70._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::Image>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::Image>_>_>_>
         ::find(in_stack_fffffffffffffec8,(key_type *)0x41ec1b);
    local_88[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::Image>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::Image>_>_>_>
         ::end(in_stack_fffffffffffffec8);
    bVar1 = std::operator==((_Self *)&local_70._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                            ,local_88);
    std::__cxx11::string::~string((string *)&local_70);
    if ((bVar1 & 1) != 0) {
      loadImageFromDisk(in_stack_ffffffffffffff88);
      FileName::operator_cast_to_string((FileName *)in_stack_fffffffffffffec8);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::Image>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::Image>_>_>_>
               ::operator[](this,(key_type *)CONCAT17(bVar1,in_stack_ffffffffffffff08));
      local_30 = &local_90;
      local_28 = pmVar2;
      if (pmVar2->ptr != (Image *)0x0) {
        (*(pmVar2->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar2->ptr = (Image *)*local_30;
      *local_30 = (long *)0x0;
      std::__cxx11::string::~string(local_b0);
      local_20 = &local_90;
      if (local_90 != (long *)0x0) {
        (**(code **)(*local_90 + 0x18))();
      }
    }
    FileName::operator_cast_to_string((FileName *)in_stack_fffffffffffffec8);
    local_10 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::Image>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::Image>_>_>_>
               ::operator[](this,(key_type *)CONCAT17(bVar1,in_stack_ffffffffffffff08));
    (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)local_10->ptr;
    if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
      (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
    }
    std::__cxx11::string::~string(local_d0);
  }
  return (Ref<embree::Image>)in_RDI;
}

Assistant:

Ref<Image> loadImage(const FileName& fileName, bool cache)
  {
    if (!cache)
      return loadImageFromDisk(fileName);

    if (image_cache.find(fileName) == image_cache.end())
      image_cache[fileName] = loadImageFromDisk(fileName);

    return image_cache[fileName];
  }